

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptProxy::SetPrototypeTrap
          (JavascriptProxy *this,RecyclableObject *newPrototype,bool shouldThrow,
          ScriptContext *requestContext)

{
  code *pcVar1;
  anon_class_40_5_61b45b38 implicitCall;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  ScriptContext *pSVar5;
  ThreadContext *pTVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  RecyclableObject *this_00;
  JavascriptFunction *function;
  Var aValue;
  Var targetProto;
  BOOL isExtensible;
  BOOL prototypeSetted;
  Var setPrototypeResult;
  JavascriptFunction *setPrototypeOfMethod;
  RecyclableObject *targetObj;
  RecyclableObject *handlerObj;
  ThreadContext *threadContext;
  ScriptContext *requestContext_local;
  bool shouldThrow_local;
  RecyclableObject *newPrototype_local;
  JavascriptProxy *this_local;
  
  pSVar5 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  ThreadContext::ProbeStack(pTVar6,0xc00,pSVar5,(PVOID)0x0);
  BVar3 = Js::JavascriptOperators::IsObjectOrNull(newPrototype);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x5fd,"(JavascriptOperators::IsObjectOrNull(newPrototype))",
                                "JavascriptOperators::IsObjectOrNull(newPrototype)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pTVar6 = ScriptContext::GetThreadContext(requestContext);
  bVar2 = ThreadContext::IsDisableImplicitCall(pTVar6);
  if (bVar2) {
    ThreadContext::AddImplicitCallFlags(pTVar6,ImplicitCall_External);
    this_local._4_4_ = 0;
  }
  else {
    pRVar8 = MarshalHandler(this,requestContext);
    if ((pRVar8 == (RecyclableObject *)0x0) && (shouldThrow)) {
      bVar2 = ThreadContext::RecordImplicitException(pTVar6);
      if (bVar2) {
        pSVar5 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
        JavascriptError::ThrowTypeError(pSVar5,-0x7ff5ea15,L"setPrototypeOf");
      }
      this_local._4_4_ = 0;
    }
    else {
      this_00 = MarshalTarget(this,requestContext);
      function = GetMethodHelper(this,0x19a,requestContext);
      pSVar5 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      bVar2 = ScriptContext::IsHeapEnumInProgress(pSVar5);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                    ,0x61f,"(!GetScriptContext()->IsHeapEnumInProgress())",
                                    "!GetScriptContext()->IsHeapEnumInProgress()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      if (function == (JavascriptFunction *)0x0) {
        JavascriptObject::ChangePrototype(this_00,newPrototype,shouldThrow,requestContext);
        this_local._4_4_ = 1;
      }
      else {
        implicitCall.setPrototypeOfMethod = function;
        implicitCall.threadContext = pTVar6;
        implicitCall.handlerObj = pRVar8;
        implicitCall.targetObj = this_00;
        implicitCall.newPrototype = newPrototype;
        aValue = ThreadContext::
                 ExecuteImplicitCall<Js::JavascriptProxy::SetPrototypeTrap(Js::RecyclableObject*,bool,Js::ScriptContext*)::__0>
                           (pTVar6,(RecyclableObject *)function,ImplicitCall_Accessor,implicitCall);
        this_local._4_4_ = JavascriptConversion::ToBoolean(aValue,requestContext);
        iVar4 = (*(this_00->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x33])();
        if (iVar4 == 0) {
          pRVar8 = RecyclableObject::GetPrototype(this_00);
          bVar2 = JavascriptConversion::SameValue(pRVar8,newPrototype);
          if (bVar2) {
            this_local._4_4_ = 1;
          }
          else {
            if (shouldThrow) {
              JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"setPrototypeOf");
            }
            this_local._4_4_ = 0;
          }
        }
        else if ((this_local._4_4_ == 0) && (shouldThrow)) {
          JavascriptError::ThrowTypeError(requestContext,-0x7ff5e9f6,L"setPrototypeOf");
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptProxy::SetPrototypeTrap(RecyclableObject* newPrototype, bool shouldThrow,
        ScriptContext * requestContext)
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);
        Assert(JavascriptOperators::IsObjectOrNull(newPrototype));

        // Reject implicit call
        ThreadContext* threadContext = requestContext->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }

        //1. Assert: Either Type(V) is Object or Type(V) is Null.
        //2. Let handler be the value of the[[ProxyHandler]] internal slot of O.
        Js::RecyclableObject *handlerObj = this->MarshalHandler(requestContext);

        //3. If handler is null, then throw a TypeError exception.
        if (handlerObj == nullptr)
        {
            // the proxy has been revoked; TypeError.
            if (shouldThrow)
            {
                if (!threadContext->RecordImplicitException())
                    return FALSE;
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_ErrorOnRevokedProxy, _u("setPrototypeOf"));
            }
        }

        //4. Let target be the value of the[[ProxyTarget]] internal slot of O.
        Js::RecyclableObject *targetObj = this->MarshalTarget(requestContext);

        //5. Let trap be the result of GetMethod(handler, "setPrototypeOf").
        //6. ReturnIfAbrupt(trap).
        //7. If trap is undefined, then
        //a.Return the result of calling the[[SetPrototypeOf]] internal method of target with argument V.
        JavascriptFunction* setPrototypeOfMethod = GetMethodHelper(PropertyIds::setPrototypeOf, requestContext);
        Assert(!GetScriptContext()->IsHeapEnumInProgress());
        if (nullptr == setPrototypeOfMethod)
        {
            JavascriptObject::ChangePrototype(targetObj, newPrototype, shouldThrow, requestContext);
            return TRUE;
        }
        //8. Let trapResult be the result of calling the[[Call]] internal method of trap with handler as the this value and a new List containing target and V.

        Var setPrototypeResult = threadContext->ExecuteImplicitCall(setPrototypeOfMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, setPrototypeOfMethod, CallInfo(CallFlags_Value, 3), handlerObj, targetObj, newPrototype);
        });

        //9. Let booleanTrapResult be ToBoolean(trapResult).
        //10. ReturnIfAbrupt(booleanTrapResult).
        //11. Let extensibleTarget be the result of IsExtensible(target).
        //12. ReturnIfAbrupt(extensibleTarget).
        //13. If extensibleTarget is true, then return booleanTrapResult.
        //14. Let targetProto be the result of calling the[[GetPrototypeOf]] internal method of target.
        //15. ReturnIfAbrupt(targetProto).
        //16. If booleanTrapResult is true and SameValue(V, targetProto) is false, then throw a TypeError exception.
        //17. Return booleanTrapResult.
        BOOL prototypeSetted = JavascriptConversion::ToBoolean(setPrototypeResult, requestContext);
        BOOL isExtensible = targetObj->IsExtensible();
        if (isExtensible)
        {
            if (!prototypeSetted && shouldThrow)
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_ProxyTrapReturnedFalse, _u("setPrototypeOf"));
            }
            return prototypeSetted;
        }
        Var targetProto = targetObj->GetPrototype();
        if (!JavascriptConversion::SameValue(targetProto, newPrototype))
        {
            if (shouldThrow)
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("setPrototypeOf"));
            }
            return FALSE;
        }
        return TRUE;
    }